

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O1

void xc_mgga_exc_vxc_fxc(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,
                        double *tau,double *zk,double *vrho,double *vsigma,double *vlapl,
                        double *vtau,double *v2rho2,double *v2rhosigma,double *v2rholapl,
                        double *v2rhotau,double *v2sigma2,double *v2sigmalapl,double *v2sigmatau,
                        double *v2lapl2,double *v2lapltau,double *v2tau2)

{
  xc_mgga_out_params out;
  
  memset(&out,0,0x230);
  out.zk = zk;
  out.vrho = vrho;
  out.vsigma = vsigma;
  out.vlapl = vlapl;
  out.vtau = vtau;
  out.v2rho2 = v2rho2;
  out.v2rhosigma = v2rhosigma;
  out.v2rholapl = v2rholapl;
  out.v2rhotau = v2rhotau;
  out.v2sigma2 = v2sigma2;
  out.v2sigmalapl = v2sigmalapl;
  out.v2sigmatau = v2sigmatau;
  out.v2lapl2 = v2lapl2;
  out.v2lapltau = v2lapltau;
  out.v2tau2 = v2tau2;
  xc_mgga_new(p,2,np,rho,sigma,lapl,tau,&out);
  return;
}

Assistant:

void xc_mgga_exc_vxc_fxc(const xc_func_type *p, size_t np,
                         const double *rho, const double *sigma, const double *lapl, const double *tau,
                         double *zk, double *vrho, double *vsigma, double *vlapl, double *vtau,
                         double *v2rho2, double *v2rhosigma, double *v2rholapl, double *v2rhotau,
                         double *v2sigma2, double *v2sigmalapl, double *v2sigmatau, double *v2lapl2,
                         double *v2lapltau, double *v2tau2)
{
  xc_mgga_out_params out;
  libxc_memset(&out, 0, sizeof(xc_mgga_out_params));
  SET_ORDER_0;
  SET_ORDER_1;
  SET_ORDER_2;

  xc_mgga_new(p, 2, np, rho, sigma, lapl, tau, &out);
}